

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_rawget(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  long *in_RSI;
  long in_RDI;
  RecordIndex ix;
  uint local_a8 [2];
  undefined8 local_a0 [5];
  uint local_78;
  int local_74;
  undefined4 local_70;
  undefined4 local_64;
  long local_58;
  undefined8 *local_50;
  undefined8 *local_48;
  undefined8 local_40;
  ulong local_38;
  undefined1 *local_30;
  undefined8 local_28;
  undefined4 local_1c;
  ulong local_18;
  undefined1 *local_10;
  undefined8 local_8;
  
  local_30 = (undefined1 *)local_a8;
  local_10 = (undefined1 *)local_a8;
  local_78 = **(uint **)(in_RDI + 0x80);
  local_74 = *(int *)(*(long *)(in_RDI + 0x80) + 4);
  if (((local_78 & 0x1f000000) == 0xb000000) && (local_74 != 0)) {
    local_70 = 0;
    local_64 = 0;
    local_28 = *(undefined8 *)(in_RDI + 0x60);
    local_a8[0] = *(uint *)*in_RSI;
    local_38 = (ulong)local_a8[0];
    local_1c = 0xfffffff4;
    local_a8[1] = 0xfffffff4;
    local_40 = *(undefined8 *)(in_RDI + 0x60);
    local_48 = local_a0;
    local_50 = (undefined8 *)(*in_RSI + 8);
    local_a0[0] = *local_50;
    local_58 = in_RDI;
    local_18 = local_38;
    local_8 = local_28;
    TVar1 = lj_record_idx((jit_State *)ix.valv,(RecordIndex *)ix.keyv);
    **(TRef **)(local_58 + 0x80) = TVar1;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_rawget(jit_State *J, RecordFFData *rd)
{
  RecordIndex ix;
  ix.tab = J->base[0]; ix.key = J->base[1];
  if (tref_istab(ix.tab) && ix.key) {
    ix.val = 0; ix.idxchain = 0;
    settabV(J->L, &ix.tabv, tabV(&rd->argv[0]));
    copyTV(J->L, &ix.keyv, &rd->argv[1]);
    J->base[0] = lj_record_idx(J, &ix);
  }  /* else: Interpreter will throw. */
}